

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O1

void __thiscall indigox::Molecule::RemoveAtom(Molecule *this,Atom_p *a)

{
  map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
  *this_00;
  Bond *this_01;
  int iVar1;
  element_type *this_02;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  int iVar6;
  AtomBondIterator AVar7;
  AtomBondIterator AVar8;
  mapped_type *ppvVar9;
  element_type *this_03;
  bool bVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
  pVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
  pVar12;
  Bond_p tmp;
  Atom_p hit;
  key_type local_98;
  undefined1 local_88 [64];
  MolAtoms *local_48;
  _Alloc_hider local_40;
  iterator local_38;
  
  Atom::GetMolecule((Atom *)local_88);
  std::__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<indigox::Molecule,void>
            ((__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2> *)&local_98,
             (__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<indigox::Molecule>);
  peVar2 = local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  if (((element_type *)local_88._0_8_ == peVar2) &&
     (local_38._M_current =
           (shared_ptr<indigox::Atom> *)
           std::
           __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<indigox::Atom>*,std::vector<std::shared_ptr<indigox::Atom>,std::allocator<std::shared_ptr<indigox::Atom>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<indigox::Atom>const>>
                     ((this->atoms_).
                      super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->atoms_).
                      super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,a),
     local_38._M_current !=
     (this->atoms_).
     super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    local_88._0_8_ =
         ((local_38._M_current)->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_88._8_8_ =
         ((local_38._M_current)->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((element_type *)local_88._8_8_)->super_enable_shared_from_this<indigox::Atom>).
                 _M_weak_this.super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((element_type *)local_88._8_8_)->
                      super_enable_shared_from_this<indigox::Atom>)._M_weak_this.
                      super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((element_type *)local_88._8_8_)->super_enable_shared_from_this<indigox::Atom>).
                 _M_weak_this.super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((element_type *)local_88._8_8_)->
                      super_enable_shared_from_this<indigox::Atom>)._M_weak_this.
                      super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      }
    }
    AVar7 = Atom::BeginBond((Atom *)local_88._0_8_);
    local_48 = &this->atoms_;
    this_01 = (Bond *)(local_88 + 0x10);
    local_40._M_p = (pointer)this;
    for (; AVar8 = Atom::EndBond((Atom *)local_88._0_8_), AVar7._M_current != AVar8._M_current;
        AVar7._M_current = AVar7._M_current + 1) {
      local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((AVar7._M_current)->super___weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar6 = (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count;
        do {
          if (iVar6 == 0) {
            local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar1 = (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count;
          bVar10 = iVar6 == iVar1;
          if (bVar10) {
            (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count = iVar6 + 1;
            iVar1 = iVar6;
          }
          iVar6 = iVar1;
          UNLOCK();
        } while (!bVar10);
      }
      if (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar10 = true;
      }
      else {
        bVar10 = (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count == 0;
      }
      if (bVar10) {
        local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
      }
      else {
        local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             ((AVar7._M_current)->super___weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
      }
      pVar11 = std::
               _Rb_tree<std::shared_ptr<indigox::Bond>,_std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
               ::equal_range(&(this->bond_to_edge_)._M_t,&local_98);
      std::
      _Rb_tree<std::shared_ptr<indigox::Bond>,_std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
      ::_M_erase_aux(&(this->bond_to_edge_)._M_t,(_Base_ptr)pVar11.first._M_node,
                     (_Base_ptr)pVar11.second._M_node);
      Bond::GetSourceAtom(this_01);
      uVar4 = local_88._16_8_;
      uVar3 = local_88._0_8_;
      if ((element_type *)local_88._24_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._24_8_);
      }
      if (uVar4 == uVar3) {
        Bond::GetTargetAtom(this_01);
        local_88._32_8_ =
             local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_88._40_8_ =
             local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
          }
        }
        Atom::RemoveBond((Atom *)local_88._16_8_,(Bond_p *)(local_88 + 0x20));
        this_03 = (element_type *)local_88._40_8_;
      }
      else {
        Bond::GetSourceAtom(this_01);
        local_88._48_8_ =
             local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_88._56_8_ =
             local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
          }
        }
        Atom::RemoveBond((Atom *)local_88._16_8_,(Bond_p *)(local_88 + 0x30));
        this_03 = (element_type *)local_88._56_8_;
      }
      if (this_03 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
      }
      if ((element_type *)local_88._24_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._24_8_);
      }
      Bond::Clear(local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>::
    _M_erase(local_48,local_38);
    _Var5._M_p = local_40._M_p;
    this_02 = (((MolecularGraph_p *)(local_40._M_p + 0x140))->
              super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
               *)(local_40._M_p + 0xe0);
    ppvVar9 = std::
              map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
              ::at(this_00,(key_type *)local_88);
    utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
    RemoveVertex(&this_02->super__MolGraph,*ppvVar9);
    pVar12 = std::
             _Rb_tree<std::shared_ptr<indigox::Atom>,_std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
             ::equal_range((_Rb_tree<std::shared_ptr<indigox::Atom>,_std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                            *)this_00,(key_type *)local_88);
    std::
    _Rb_tree<std::shared_ptr<indigox::Atom>,_std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
    ::_M_erase_aux((_Rb_tree<std::shared_ptr<indigox::Atom>,_std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                    *)this_00,(_Base_ptr)pVar12.first._M_node,(_Base_ptr)pVar12.second._M_node);
    Atom::Clear((Atom *)local_88._0_8_);
    _Var5._M_p[0x158] = true;
    if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
  }
  return;
}

Assistant:

void Molecule::RemoveAtom(Atom_p a) {
  if (a->GetMolecule() != shared_from_this()) return;
  auto it = std::find(atoms_.begin(), atoms_.end(), a);
  if (it != atoms_.end()) {
    Atom_p hit = *it;
    for (AtomBondIterator bs = hit->BeginBond(); bs != hit->EndBond(); ++bs) {
      Bond_p tmp = bs->lock();
      bond_to_edge_.erase(tmp);
      if (tmp->GetSourceAtom() != hit) tmp->GetSourceAtom()->RemoveBond(tmp);
      else tmp->GetTargetAtom()->RemoveBond(tmp);
      tmp->Clear();
    }
    atoms_.erase(it);
    graph_->RemoveVertex(atom_to_vertex_.at(hit));
    atom_to_vertex_.erase(hit);
    hit->Clear();
    modified_ = true;
  }
}